

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall nonius::html_reporter::do_suite_complete(html_reporter *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *pfVar2;
  void *pvVar3;
  pointer pdVar4;
  html_reporter *phVar5;
  string *psVar6;
  mapped_type *pmVar7;
  undefined1 *puVar8;
  DataList *__p;
  _Hash_node_base *p_Var9;
  basic_ostream<char,_std::char_traits<char>_> *stream;
  pointer pcVar10;
  pointer prVar11;
  pointer pdVar12;
  double dVar13;
  double dVar14;
  data_map item_1;
  data_map item;
  data_map run_item;
  data_list params;
  data_map map;
  string local_240;
  undefined1 local_220 [32];
  float local_200;
  size_t local_1f8;
  __node_base_ptr p_Stack_1f0;
  key_type local_1e8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  float local_1a8;
  undefined4 uStack_1a4;
  pointer local_1a0;
  __node_base_ptr p_Stack_198;
  pointer local_190;
  pointer local_180;
  duration<double,_std::ratio<1L,_1L>_> local_178;
  duration<double,_std::ratio<1L,_1L>_> local_158;
  undefined1 local_118 [32];
  float local_f8;
  size_t local_f0;
  __node_base_ptr p_Stack_e8;
  pointer local_e0;
  vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> local_d8;
  string *local_b8;
  html_reporter *local_b0;
  pointer local_a8;
  _Hash_node_base *local_a0;
  double local_98;
  double local_90;
  string local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\ngenerating HTML report\n",0x18);
  }
  psVar6 = template_string_abi_cxx11_();
  dVar13 = ideal_magnitude(this);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  escape((string *)local_1c8,&this->title);
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"title","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_68,(key_type *)local_118);
  cpptempl::data_ptr::operator=(pmVar7,(string *)local_1c8);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if (dVar13 <= 1.0) {
    puVar8 = local_1c8 + 0x11;
    local_1b8._M_local_buf[0] = 0x73;
    local_1c8._8_8_ = 1;
  }
  else {
    puVar8 = local_1c8 + 0x12;
    if (dVar13 <= 1000.0) {
      local_1b8._M_allocated_capacity._0_2_ = 0x736d;
    }
    else {
      if (dVar13 <= 1000000.0) {
        puVar8 = local_1c8 + 0x13;
        local_1b8._M_allocated_capacity._0_3_ = 0x730000;
        local_1b8._M_allocated_capacity._0_2_ = 0xbcce;
        local_1c8._8_8_ = 3;
        goto LAB_00143cb1;
      }
      local_1b8._M_allocated_capacity._0_2_ = 0x736e;
    }
    local_1c8._8_8_ = 2;
  }
LAB_00143cb1:
  local_1c8._0_8_ = local_1c8 + 0x10;
  *puVar8 = 0;
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"units","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_68,(key_type *)local_118);
  cpptempl::data_ptr::operator=(pmVar7,(string *)local_1c8);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"logarithmic","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_68,(key_type *)local_1c8);
  cpptempl::data_ptr::operator=(pmVar7,&this->logarithmic);
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"runparam","");
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&local_68,(key_type *)local_1c8);
  cpptempl::data_ptr::operator=(pmVar7,&this->run_param);
  local_b8 = psVar6;
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  prVar11 = (this->runs).
            super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (this->runs).
             super__Vector_base<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_b0 = this;
  if (prVar11 != local_a8) {
    paVar1 = &local_240.field_2;
    dVar13 = dVar13 * 1000.0;
    do {
      pcVar10 = local_220 + 0x10;
      local_118._0_8_ = &p_Stack_e8;
      local_118._8_8_ = 1;
      local_118._16_8_ = 0;
      local_118._24_8_ = 0;
      local_f8 = 1.0;
      local_f0 = 0;
      p_Stack_e8 = (__node_base_ptr)0x0;
      local_d8.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.super__Vector_base<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e0 = prVar11;
      for (p_Var9 = (prVar11->params).
                    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
                    ._M_h._M_before_begin._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
          p_Var9 = p_Var9->_M_nxt) {
        local_1c8._0_8_ = &p_Stack_198;
        local_1c8._8_8_ = 1;
        local_1b8._M_allocated_capacity = 0;
        local_1b8._8_8_ = 0;
        local_1a8 = 1.0;
        local_1a0 = (pointer)0x0;
        p_Stack_198 = (__node_base_ptr)0x0;
        local_220._0_8_ = pcVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"name","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_1c8,(key_type *)local_220);
        cpptempl::data_ptr::operator=(pmVar7,(string *)(p_Var9 + 1));
        if ((pointer)local_220._0_8_ != pcVar10) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        local_220._0_8_ = pcVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"value","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_1c8,(key_type *)local_220);
        cpptempl::data_ptr::operator=(pmVar7,(param *)(p_Var9 + 5));
        if ((pointer)local_220._0_8_ != pcVar10) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        cpptempl::data_ptr::data_ptr<cpptempl::data_map>
                  ((data_ptr *)local_220,(data_map *)local_1c8);
        std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::
        emplace_back<cpptempl::data_ptr>(&local_d8,(data_ptr *)local_220);
        local_220._0_8_ = &PTR__data_ptr_0020bde8;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._16_8_);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_1c8);
      }
      __p = (DataList *)operator_new(0x20);
      prVar11 = local_e0;
      (__p->super_Data)._vptr_Data = (_func_int **)&PTR_empty_0020b7b0;
      std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::vector
                (&__p->m_items,&local_d8);
      local_220._0_8_ = &PTR__data_ptr_0020bde8;
      local_220._8_8_ = __p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cpptempl::DataList*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 0x10),__p);
      local_1c8._0_8_ = local_1c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"params","");
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_118,(key_type *)local_1c8);
      (pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_220._8_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar7->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 0x10));
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
      }
      local_220._0_8_ = &PTR__data_ptr_0020bde8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._16_8_);
      }
      p_Var9 = (prVar11->data)._M_h._M_before_begin._M_nxt;
      while (p_Var9 != (_Hash_node_base *)0x0) {
        local_a0 = p_Var9;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
                *)local_1c8,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
                *)(p_Var9 + 1));
        local_220._0_8_ = &p_Stack_1f0;
        local_220._8_8_ = (DataList *)0x1;
        local_220._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_220._24_8_ = 0;
        local_200 = 1.0;
        local_1f8 = 0;
        p_Stack_1f0 = (__node_base_ptr)0x0;
        escape(&local_240,(string *)local_1c8);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"name","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_220,&local_1e8);
        cpptempl::data_ptr::operator=(pmVar7,&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,
                          (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar1) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        dVar14 = trunc(local_178.__r * dVar13);
        local_1e8._M_dataplus._M_p = (pointer)(dVar14 * 0.001);
        local_240._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"mean","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_220,&local_240);
        cpptempl::data_ptr::operator=(pmVar7,(double *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar1) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        dVar14 = trunc(local_158.__r * dVar13);
        local_1e8._M_dataplus._M_p = (pointer)(dVar14 * 0.001);
        local_240._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"stddev","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_220,&local_240);
        cpptempl::data_ptr::operator=(pmVar7,(double *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar1) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        pdVar4 = local_1a0;
        for (pdVar12 = (pointer)CONCAT44(uStack_1a4,local_1a8); pdVar12 != pdVar4;
            pdVar12 = pdVar12 + 1) {
          local_98 = pdVar12->__r;
          local_240._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"samples","");
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_220,&local_240);
          local_90 = trunc(local_98 * dVar13);
          local_90 = local_90 * 0.001;
          cpptempl::data_ptr::data_ptr<double>((data_ptr *)&local_1e8,&local_90);
          cpptempl::data_ptr::push_back(pmVar7,(data_ptr *)&local_1e8);
          local_1e8._M_dataplus._M_p = (pointer)&PTR__data_ptr_0020bde8;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_1e8.field_2._M_allocated_capacity !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_1e8.field_2._M_allocated_capacity);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != paVar1) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
        }
        local_240._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"benchmarks","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_118,&local_240);
        cpptempl::data_ptr::data_ptr<cpptempl::data_map>
                  ((data_ptr *)&local_1e8,(data_map *)local_220);
        cpptempl::data_ptr::push_back(pmVar7,(data_ptr *)&local_1e8);
        local_1e8._M_dataplus._M_p = (pointer)&PTR__data_ptr_0020bde8;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8.field_2._M_allocated_capacity
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_1e8.field_2._M_allocated_capacity);
        }
        prVar11 = local_e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != paVar1) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_220);
        if (local_190 != (pointer)0x0) {
          operator_delete(local_190,(long)local_180 - (long)local_190);
        }
        pvVar3 = (void *)CONCAT44(uStack_1a4,local_1a8);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,(long)p_Stack_198 - (long)pvVar3);
        }
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
        }
        p_Var9 = local_a0->_M_nxt;
      }
      local_1c8._0_8_ = local_1c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"runs","");
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_68,(key_type *)local_1c8);
      cpptempl::data_ptr::data_ptr<cpptempl::data_map>((data_ptr *)local_220,(data_map *)local_118);
      cpptempl::data_ptr::push_back(pmVar7,(data_ptr *)local_220);
      local_220._0_8_ = &PTR__data_ptr_0020bde8;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_220._16_8_);
      }
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
      }
      std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::~vector(&local_d8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_118);
      prVar11 = prVar11 + 1;
    } while (prVar11 != local_a8);
  }
  phVar5 = local_b0;
  if ((local_b0->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar2 = &(local_b0->super_reporter).os;
    stream = (*(local_b0->super_reporter).os._M_invoker)((_Any_data *)pfVar2);
    pcVar10 = (local_b8->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar10,pcVar10 + local_b8->_M_string_length);
    cpptempl::parse(stream,&local_88,(data_map *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((phVar5->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(phVar5->super_reporter).os._M_invoker)((_Any_data *)pfVar2);
      std::ostream::flush();
      if (phVar5->verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done\n",5);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpptempl::data_ptr>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      return;
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

void do_suite_complete() override {
            if(verbose) progress_stream() << "\ngenerating HTML report\n";

            auto&& templ = template_string();
            auto magnitude = ideal_magnitude();

            cpptempl::data_map map;
            map["title"] = escape(title);
            map["units"] = detail::units_for_magnitude(magnitude);
            map["logarithmic"] = logarithmic;
            map["runparam"] = run_param;
            for (auto&& r : runs) {
                cpptempl::data_map run_item;
                cpptempl::data_list params;
                for (auto&& p : r.params) {
                    cpptempl::data_map item;
                    item["name"] = p.first;
                    item["value"] = p.second;
                    params.push_back(item);
                }
                run_item["params"] = cpptempl::make_data(params);
                for(auto d : r.data) {
                    cpptempl::data_map item;
                    item["name"] = escape(d.first);
                    item["mean"] = truncate(d.second.analysis.mean.point.count() * magnitude);
                    item["stddev"] = truncate(d.second.analysis.standard_deviation.point.count() * magnitude);
                    for(auto e : d.second.samples)
                        item["samples"].push_back(truncate(e.count() * magnitude));
                    run_item["benchmarks"].push_back(item);
                }
                map["runs"].push_back(run_item);
            }

            cpptempl::parse(report_stream(), templ, map);
            report_stream() << std::flush;
            if(verbose) progress_stream() << "done\n";
        }